

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall
ThreadedReplayer::set_application_info
          (ThreadedReplayer *this,Hash param_1,VkApplicationInfo *app,
          VkPhysicalDeviceFeatures2 *features)

{
  unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_> *puVar1;
  VulkanDevice *pVVar2;
  pointer pcVar3;
  DatabaseInterface *pDVar4;
  bool bVar5;
  int iVar6;
  VkResult VVar7;
  VulkanDevice *pVVar8;
  VulkanProperties *pVVar9;
  DatabaseInterface *pDVar10;
  FILE *pFVar11;
  size_type sVar12;
  size_t sVar13;
  char *__s;
  uint i;
  long lVar14;
  bool *this_00;
  long in_FS_OFFSET;
  string path;
  char uuid_string [33];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  undefined1 local_68 [32];
  pointer *local_48;
  VulkanProperties *local_40;
  bool *local_38;
  
  if (((this->per_thread_data).
       super__Vector_base<ThreadedReplayer::PerThreadData,_std::allocator<ThreadedReplayer::PerThreadData>_>
       ._M_impl.super__Vector_impl_data._M_start[*(uint *)(in_FS_OFFSET + -0x18)].expected_tag ==
       RESOURCE_APPLICATION_INFO) && (this->device_was_init == false)) {
    if (-1 < crash_fd) {
      write_all(crash_fd,"BEGIN_HEARTBEAT\n");
    }
    this->device_was_init = true;
    pVVar8 = (VulkanDevice *)operator_new(0x1318);
    *(undefined ***)pVVar8 = &PTR__VulkanDevice_002b9da0;
    pVVar8->api_version = 0;
    local_40 = &pVVar8->props;
    memset(&pVVar8->instance,0,0x144);
    memset(&(pVVar8->gpu_props).limits,0,0x20c);
    pVVar8->validation_callback = (_func_void_void_ptr *)0x0;
    pVVar8->validation_callback_userdata = (void *)0x0;
    *(undefined8 *)((long)&pVVar8->validation_callback_userdata + 6) = 0;
    memset(&pVVar8->features,0,0xba4);
    memset(local_40,0,0x3cc);
    Fossilize::FeatureFilter::FeatureFilter(&pVVar8->feature_filter);
    (pVVar8->ycbcr_conversions).
    super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)
     &(pVVar8->ycbcr_conversions).
      super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
      ._M_impl = 0;
    (pVVar8->ycbcr_conversions).
    super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar2 = (this->device)._M_t.
             super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
             .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl;
    (this->device)._M_t.
    super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>.
    _M_t.
    super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
    .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl = pVVar8;
    if (pVVar2 != (VulkanDevice *)0x0) {
      (**(code **)(*(long *)pVVar2 + 8))();
    }
    (this->device_opts).application_info = app;
    (this->device_opts).features = features;
    (this->device_opts).want_pipeline_stats = (this->opts).pipeline_stats;
    pVVar9 = (VulkanProperties *)std::chrono::_V2::steady_clock::now();
    bVar5 = Fossilize::VulkanDevice::init_device
                      ((this->device)._M_t.
                       super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                       .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
                       &this->device_opts);
    if (!bVar5) {
      set_application_info();
      return;
    }
    puVar1 = &this->device;
    this_00 = &(this->opts).pipeline_stats;
    Fossilize::VulkanDevice::set_validation_error_callback
              ((this->device)._M_t.
               super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
               .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
               on_validation_error,this);
    if (((this->opts).pipeline_stats == true) &&
       (((puVar1->_M_t).
         super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
         ._M_t.
         super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
         .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->pipeline_stats ==
        false)) {
      set_application_info((ThreadedReplayer *)this_00);
    }
    if (((this->opts).on_disk_module_identifier_path._M_string_length != 0) &&
       (pVVar2 = (puVar1->_M_t).
                 super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                 .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl,
       pVVar2->supports_module_identifiers == true)) {
      __s = local_68;
      lVar14 = 0;
      local_40 = pVVar9;
      local_38 = this_00;
      do {
        sprintf(__s,"%02x",
                (ulong)(pVVar2->props).shader_module_identifier.shaderModuleIdentifierAlgorithmUUID
                       [lVar14]);
        lVar14 = lVar14 + 1;
        __s = __s + 2;
      } while (lVar14 != 0x10);
      report_module_uuid((char (*) [33])local_68);
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar3 = (this->opts).on_disk_module_identifier_path._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar3,
                 pcVar3 + (this->opts).on_disk_module_identifier_path._M_string_length);
      std::__cxx11::string::push_back((char)(string *)&local_88);
      std::__cxx11::string::append((char *)&local_88);
      std::__cxx11::string::append((char *)&local_88);
      pDVar10 = Fossilize::create_stream_archive_database
                          ((char *)local_88.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,Append);
      pDVar4 = (this->module_identifier_db)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (this->module_identifier_db)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar10;
      if (pDVar4 != (DatabaseInterface *)0x0) {
        (*pDVar4->_vptr_DatabaseInterface[1])();
      }
      iVar6 = (*((this->module_identifier_db)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl)->
                _vptr_DatabaseInterface[2])();
      pVVar9 = local_40;
      if ((char)iVar6 == '\0') {
        set_application_info((ThreadedReplayer *)&this->module_identifier_db);
      }
      this_00 = local_38;
      if ((pointer *)
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (ulong)(local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        this_00 = local_38;
      }
    }
    if (*this_00 == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     &(this->opts).pipeline_stats_path,".__tmp.foz");
      pDVar10 = Fossilize::create_stream_archive_database((char *)local_68._0_8_,OverWrite);
      pDVar4 = (this->pipeline_stats_db)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (this->pipeline_stats_db)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl = pDVar10;
      if (pDVar4 != (DatabaseInterface *)0x0) {
        (*pDVar4->_vptr_DatabaseInterface[1])();
      }
      iVar6 = (*((this->pipeline_stats_db)._M_t.
                 super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                 .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl)->
                _vptr_DatabaseInterface[2])();
      if ((char)iVar6 == '\0') {
        set_application_info();
      }
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
    }
    if ((this->opts).on_disk_pipeline_cache_path._M_string_length != 0) {
      local_68._8_8_ = (void *)0x0;
      local_68._16_8_ = 0;
      local_68._24_8_ = 0;
      local_48 = (pointer *)0x0;
      local_68._0_8_ = (char *)0x11;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pFVar11 = fopen((this->opts).on_disk_pipeline_cache_path._M_dataplus._M_p,"rb");
      if (pFVar11 != (FILE *)0x0) {
        fseek(pFVar11,0,2);
        sVar12 = ftell(pFVar11);
        rewind(pFVar11);
        if (sVar12 != 0) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,sVar12);
          sVar13 = fread(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,1,sVar12,pFVar11);
          if (sVar13 == sVar12) {
            bVar5 = validate_pipeline_cache_header(this,&local_88);
            if (bVar5) {
              local_48 = (pointer *)
                         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              local_68._24_8_ =
                   (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
            }
            else {
              set_application_info();
            }
          }
        }
      }
      VVar7 = (*vkCreatePipelineCache)
                        (((this->device)._M_t.
                          super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                          .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                         device,(VkPipelineCacheCreateInfo *)local_68,(VkAllocationCallbacks *)0x0,
                         &this->disk_pipeline_cache);
      if (VVar7 != VK_SUCCESS) {
        set_application_info();
      }
      if ((pointer *)
          local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((this->opts).on_disk_validation_cache_path._M_string_length != 0) {
      if (((puVar1->_M_t).
           super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
           .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->validation_cache
          == true) {
        local_68._8_8_ = (void *)0x0;
        local_68._16_8_ = 0;
        local_68._24_8_ = 0;
        local_48 = (pointer *)0x0;
        local_68._0_8_ = (char *)0x3b9d3b00;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pFVar11 = fopen((this->opts).on_disk_validation_cache_path._M_dataplus._M_p,"rb");
        if (pFVar11 != (FILE *)0x0) {
          fseek(pFVar11,0,2);
          sVar12 = ftell(pFVar11);
          rewind(pFVar11);
          if (sVar12 != 0) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,sVar12);
            sVar13 = fread(local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,1,sVar12,pFVar11);
            if (sVar13 == sVar12) {
              bVar5 = validate_validation_cache_header(this,&local_88);
              if (bVar5) {
                local_48 = (pointer *)
                           local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                local_68._24_8_ =
                     (long)local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
              }
              else {
                set_application_info();
              }
            }
          }
        }
        VVar7 = (*vkCreateValidationCacheEXT)
                          (((this->device)._M_t.
                            super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                            .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->
                           device,(VkValidationCacheCreateInfoEXT *)local_68,
                           (VkAllocationCallbacks *)0x0,&this->validation_cache);
        if (VVar7 != VK_SUCCESS) {
          set_application_info();
        }
        if ((pointer *)
            local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        set_application_info();
      }
    }
    if (((this->opts).replayer_cache_path._M_string_length != 0) &&
       (bVar5 = init_replayer_cache(this), !bVar5)) {
      set_application_info();
    }
    lVar14 = std::chrono::_V2::steady_clock::now();
    fprintf(_stderr,"Fossilize INFO: Creating Vulkan device took: %ld ms\n",
            (lVar14 - (long)pVVar9) / 1000000);
    fflush(_stderr);
    if (app != (VkApplicationInfo *)0x0) {
      set_application_info((ThreadedReplayer *)app);
    }
  }
  return;
}

Assistant:

void set_application_info(Hash, const VkApplicationInfo *app, const VkPhysicalDeviceFeatures2 *features) override
	{
		// TODO: Could use this to create multiple VkDevices for replay as necessary if app changes.
		if (get_per_thread_data().expected_tag != RESOURCE_APPLICATION_INFO)
			return;

		if (!device_was_init)
		{
			// From this point on, we expect forward progress in finite time.
			// If the Vulkan driver is unstable and deadlocks, we'll be able to detect it and kill the process.
			begin_heartbeat();

			// Now we can init the device with correct app info.
			device_was_init = true;
			device.reset(new VulkanDevice);
			device_opts.application_info = app;
			device_opts.features = features;
			device_opts.want_pipeline_stats = opts.pipeline_stats;
			auto start_device = chrono::steady_clock::now();
			if (!device->init_device(device_opts))
			{
				LOGE("Failed to create Vulkan device, bailing ...\n");
				exit(EXIT_FAILURE);
			}

			device->set_validation_error_callback(on_validation_error, this);

			if (opts.pipeline_stats && !device->has_pipeline_stats())
			{
				LOGI("Requested pipeline stats, but device does not support them. Disabling.\n");
				opts.pipeline_stats = false;
			}

			if (!opts.on_disk_module_identifier_path.empty() && device->module_identifiers_enabled())
			{
				auto &props = device->get_module_identifier_properties();
				char uuid_string[2 * VK_UUID_SIZE + 1];
				for (unsigned i = 0; i < VK_UUID_SIZE; i++)
					sprintf(uuid_string + 2 * i, "%02x", props.shaderModuleIdentifierAlgorithmUUID[i]);

				report_module_uuid(uuid_string);

				auto path = opts.on_disk_module_identifier_path;
				path += '.';
				path += uuid_string;
				path += ".foz";
				module_identifier_db.reset(create_stream_archive_database(path.c_str(), DatabaseMode::Append));
				if (!module_identifier_db->prepare())
				{
					LOGW("Failed to prepare module identifier database. Disabling identifiers.\n");
					module_identifier_db.reset();
				}
			}

			if (opts.pipeline_stats)
			{
				auto foz_path = opts.pipeline_stats_path + ".__tmp.foz";
				pipeline_stats_db.reset(create_stream_archive_database(foz_path.c_str(), DatabaseMode::OverWrite));
				if (!pipeline_stats_db->prepare())
				{
					LOGW("Failed to prepare stats database. Disabling pipeline stats.\n");
					pipeline_stats_db.reset();
					opts.pipeline_stats = false;
				}
			}

			if (!opts.on_disk_pipeline_cache_path.empty())
			{
				VkPipelineCacheCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO };
				vector<uint8_t> on_disk_cache;

				// Try to load on-disk cache.
				FILE *file = fopen(opts.on_disk_pipeline_cache_path.c_str(), "rb");
				if (file)
				{
					fseek(file, 0, SEEK_END);
					size_t len = ftell(file);
					rewind(file);

					if (len != 0)
					{
						on_disk_cache.resize(len);
						if (fread(on_disk_cache.data(), 1, len, file) == len)
						{
							if (validate_pipeline_cache_header(on_disk_cache))
							{
								info.pInitialData = on_disk_cache.data();
								info.initialDataSize = on_disk_cache.size();
							}
							else
								LOGI("Failed to validate pipeline cache. Creating a blank one.\n");
						}
					}
				}

				if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
				{
					LOGW("Failed to create pipeline cache, trying to create a blank one.\n");
					info.initialDataSize = 0;
					info.pInitialData = nullptr;
					if (vkCreatePipelineCache(device->get_device(), &info, nullptr, &disk_pipeline_cache) != VK_SUCCESS)
					{
						LOGE("Failed to create pipeline cache.\n");
						disk_pipeline_cache = VK_NULL_HANDLE;
					}
				}
			}

			if (!opts.on_disk_validation_cache_path.empty())
			{
				if (device->has_validation_cache())
				{
					VkValidationCacheCreateInfoEXT info = {VK_STRUCTURE_TYPE_VALIDATION_CACHE_CREATE_INFO_EXT };
					vector<uint8_t> on_disk_cache;

					FILE *file = fopen(opts.on_disk_validation_cache_path.c_str(), "rb");
					if (file)
					{
						fseek(file, 0, SEEK_END);
						size_t len = ftell(file);
						rewind(file);

						if (len != 0)
						{
							on_disk_cache.resize(len);
							if (fread(on_disk_cache.data(), 1, len, file) == len)
							{
								if (validate_validation_cache_header(on_disk_cache))
								{
									info.pInitialData = on_disk_cache.data();
									info.initialDataSize = on_disk_cache.size();
								}
								else
									LOGI("Failed to validate validation cache. Creating a blank one.\n");
							}
						}
					}

					if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
					{
						LOGW("Failed to create validation cache, trying to create a blank one.\n");
						info.initialDataSize = 0;
						info.pInitialData = nullptr;
						if (vkCreateValidationCacheEXT(device->get_device(), &info, nullptr, &validation_cache) != VK_SUCCESS)
						{
							LOGE("Failed to create validation cache.\n");
							validation_cache = VK_NULL_HANDLE;
						}
					}
				}
				else
				{
					LOGE("Requested validation cache, but validation layers do not support this extension.\n");
				}
			}

			if (!opts.replayer_cache_path.empty())
				if (!init_replayer_cache())
					LOGW("Failed to initialize replayer cache. Ignoring!\n");

			auto end_device = chrono::steady_clock::now();
			long time_ms = chrono::duration_cast<chrono::milliseconds>(end_device - start_device).count();
			LOGI("Creating Vulkan device took: %ld ms\n", time_ms);

			if (app)
			{
				LOGI("Replaying for application:\n");
				LOGI("  apiVersion: %u.%u.%u\n",
				     VK_VERSION_MAJOR(app->apiVersion),
				     VK_VERSION_MINOR(app->apiVersion),
				     VK_VERSION_PATCH(app->apiVersion));
				LOGI("  engineVersion: %u\n", app->engineVersion);
				LOGI("  applicationVersion: %u\n", app->applicationVersion);
				if (app->pEngineName)
					LOGI("  engineName: %s\n", app->pEngineName);
				if (app->pApplicationName)
					LOGI("  applicationName: %s\n", app->pApplicationName);
			}
		}
	}